

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O0

ON__UINT32
ON_UnicodeMapCodePoint(ON_Locale *locale,ON_StringMapType map_type,ON__UINT32 unicode_code_point)

{
  bool bVar1;
  ON_StringMapOrdinalType map_type_00;
  int element_count;
  ON__UINT32 OVar2;
  ON__UINT32 OVar3;
  undefined1 local_80 [8];
  ON_UnicodeErrorParameters e;
  ON__UINT32 mapped_unicode_code_point;
  int mapped_count;
  int w_count;
  wchar_t mapped_w [7];
  wchar_t w [7];
  ON__UINT32 unicode_code_point_local;
  ON_StringMapType map_type_local;
  ON_Locale *locale_local;
  
  bVar1 = ON_Locale::IsOrdinalOrInvariantCulture(locale);
  if (bVar1) {
    map_type_00 = ON_StringMapOrdinalTypeFromStringMapType(map_type);
    locale_local._4_4_ = ON_UnicodeMapCodePointOrdinal(map_type_00,unicode_code_point);
  }
  else {
    memset(mapped_w + 6,0,0x1c);
    memset(&mapped_count,0,0x1c);
    element_count = ON_EncodeWideChar(unicode_code_point,6,mapped_w + 6);
    locale_local._4_4_ = unicode_code_point;
    if (((0 < element_count) &&
        (OVar2 = ON_wString::MapString(locale,map_type,mapped_w + 6,element_count,&mapped_count,6),
        0 < (int)OVar2)) &&
       (e.m_error_mask = unicode_code_point, e.m_error_code_point = OVar2,
       OVar3 = ON_DecodeWideChar(mapped_w + 6,element_count,(ON_UnicodeErrorParameters *)local_80,
                                 &e.m_error_mask), OVar2 == OVar3)) {
      locale_local._4_4_ = e.m_error_mask;
    }
  }
  return locale_local._4_4_;
}

Assistant:

ON__UINT32 ON_UnicodeMapCodePoint(
  const ON_Locale& locale,
  ON_StringMapType map_type,
  ON__UINT32 unicode_code_point
  )
{
  if (locale.IsOrdinalOrInvariantCulture())
    return ON_UnicodeMapCodePointOrdinal(ON_StringMapOrdinalTypeFromStringMapType(map_type), unicode_code_point);

  wchar_t w[7] = { 0 };
  wchar_t mapped_w[7] = { 0 };
  int w_count = ON_EncodeWideChar(unicode_code_point, 6,  w);
  if (w_count > 0)
  {
    int mapped_count = ON_wString::MapString(locale, map_type, w, w_count, mapped_w, sizeof(mapped_w) / sizeof(mapped_w[0]) - 1);
    if (mapped_count > 0)
    {
      ON__UINT32 mapped_unicode_code_point = unicode_code_point;
      ON_UnicodeErrorParameters e;
      if ( mapped_count == ON_DecodeWideChar(w,w_count,&e,&mapped_unicode_code_point) )
        return mapped_unicode_code_point;
    }
  }

  return unicode_code_point;
}